

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagAlias::TagAlias(TagAlias *this,string *_tag,SourceLineInfo *_lineInfo)

{
  std::__cxx11::string::string((string *)this,(string *)_tag);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}